

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void wasm::SimplifyLocals<true,_false,_true>::scan
               (SimplifyLocals<true,_false,_true> *self,Expression **currp)

{
  LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  *this;
  Expression *pEVar1;
  
  this = &(self->
          super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
          ).
          super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  ;
  Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
              *)this,visitPost,currp);
  pEVar1 = *currp;
  if (pEVar1->_id == IfId) {
    if (*(long *)(pEVar1 + 2) != 0) {
      Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                  *)this,doNoteIfFalse,currp);
      Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                  *)this,scan,(Expression **)(pEVar1 + 2));
    }
    Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                *)this,doNoteIfTrue,currp);
    Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                *)this,scan,(Expression **)&pEVar1[1].type);
    Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                *)this,doNoteIfCondition,currp);
    Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                *)this,scan,(Expression **)(pEVar1 + 1));
  }
  else {
    LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
    ::scan(self,currp);
  }
  Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  ::pushTask((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
              *)this,visitPre,currp);
  return;
}

Assistant:

static void scan(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
                   Expression** currp) {
    self->pushTask(visitPost, currp);

    auto* curr = *currp;

    if (auto* iff = curr->dynCast<If>()) {
      // handle if in a special manner, using the ifStack for if-elses etc.
      if (iff->ifFalse) {
        self->pushTask(
          SimplifyLocals<allowTee, allowStructure, allowNesting>::doNoteIfFalse,
          currp);
        self->pushTask(
          SimplifyLocals<allowTee, allowStructure, allowNesting>::scan,
          &iff->ifFalse);
      }
      self->pushTask(
        SimplifyLocals<allowTee, allowStructure, allowNesting>::doNoteIfTrue,
        currp);
      self->pushTask(
        SimplifyLocals<allowTee, allowStructure, allowNesting>::scan,
        &iff->ifTrue);
      self->pushTask(SimplifyLocals<allowTee, allowStructure, allowNesting>::
                       doNoteIfCondition,
                     currp);
      self->pushTask(
        SimplifyLocals<allowTee, allowStructure, allowNesting>::scan,
        &iff->condition);
    } else {
      WalkerPass<LinearExecutionWalker<
        SimplifyLocals<allowTee, allowStructure, allowNesting>>>::scan(self,
                                                                       currp);
    }

    self->pushTask(visitPre, currp);
  }